

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_of(size_t n_args,...)

{
  char in_AL;
  roaring_bitmap_t *r;
  void **ppvVar1;
  uint uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  roaring_bulk_context_t context;
  void **local_f0;
  roaring_bulk_context_t local_d8;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  r = roaring_bitmap_create_with_capacity(0);
  local_d8.container = (void *)0x0;
  local_d8.idx = 0;
  local_d8.key = 0;
  local_d8.typecode = '\0';
  local_d8._15_1_ = 0;
  local_f0 = &ap[0].overflow_arg_area;
  uVar2 = 8;
  if (n_args != 0) {
    do {
      uVar3 = (ulong)uVar2;
      if (uVar3 < 0x29) {
        uVar2 = uVar2 + 8;
        ppvVar1 = (void **)((long)local_c8 + uVar3);
      }
      else {
        ppvVar1 = local_f0;
        local_f0 = local_f0 + 1;
      }
      roaring_bitmap_add_bulk(r,&local_d8,*(uint32_t *)ppvVar1);
      n_args = n_args - 1;
    } while (n_args != 0);
  }
  return r;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_of(size_t n_args, ...) {
    // todo: could be greatly optimized but we do not expect this call to ever
    // include long lists
    roaring_bitmap_t *answer = roaring_bitmap_create();
    roaring_bulk_context_t context = {0};
    va_list ap;
    va_start(ap, n_args);
    for (size_t i = 0; i < n_args; i++) {
        uint32_t val = va_arg(ap, uint32_t);
        roaring_bitmap_add_bulk(answer, &context, val);
    }
    va_end(ap);
    return answer;
}